

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void gai_zdot_patch_(Integer *g_a,char *t_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
                    Integer *g_b,char *t_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
                    DoubleComplex *retval,int alen,int blen)

{
  Integer *in_RDX;
  Integer *unaff_RBX;
  Integer *in_RSI;
  Integer *in_RDI;
  char *unaff_R12;
  Integer unaff_R14;
  Integer unaff_retaddr;
  char *in_stack_00000008;
  Integer *in_stack_00000010;
  Integer *in_stack_00000018;
  Integer *in_stack_00000020;
  Integer *in_stack_00000028;
  void *in_stack_00000030;
  Integer btype;
  Integer atype;
  Integer in_stack_00000108;
  char *in_stack_00000110;
  Integer *in_stack_00000168;
  Integer in_stack_00000170;
  undefined8 local_60;
  undefined8 local_58;
  
  pnga_inquire_type(in_stack_00000170,in_stack_00000168);
  pnga_inquire_type(in_stack_00000170,in_stack_00000168);
  if ((local_58 != local_60) || (local_58 != 0x3ef)) {
    pnga_error(in_stack_00000110,in_stack_00000108);
  }
  sga_dot_patch(unaff_R14,unaff_R12,unaff_RBX,in_RDI,in_RSI,in_RDX,unaff_retaddr,in_stack_00000008,
                in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                in_stack_00000030);
  return;
}

Assistant:

void gai_zdot_patch_(Integer *g_a, char *t_a, int alen, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, Integer *g_b, char *t_b, int blen, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, DoubleComplex *retval)
#endif
{
    Integer atype, btype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    if (atype != btype || atype != C_DCPL) pnga_error(" wrong types ", 0L);
    sga_dot_patch(*g_a, t_a, ailo, aihi, ajlo, ajhi, *g_b, t_b, bilo, bihi, bjlo, bjhi, retval);
}